

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void AddInlineVisibilityCompileOption
               (string *flags,cmGeneratorTarget *target,cmLocalGenerator *lg,string *warnCMP0063,
               string *lang)

{
  bool bVar1;
  cmMakefile *this;
  string *psVar2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_c9;
  undefined4 local_c8;
  bool prop;
  cmValue local_b8;
  cmValue opt;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string compileOption;
  string *lang_local;
  string *warnCMP0063_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  
  compileOption.field_2._8_8_ = lang;
  cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&opt,(string *)compileOption.field_2._8_8_);
  cmStrCat<char[43]>((string *)local_50,&local_80,(cmAlphaNum *)&opt,
                     (char (*) [43])"_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN");
  this = cmLocalGenerator::GetMakefile(lg);
  local_b8 = cmMakefile::GetDefinition(this,(string *)local_50);
  bVar1 = cmValue::operator_cast_to_bool(&local_b8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"VISIBILITY_INLINES_HIDDEN",&local_f1);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    local_c9 = bVar1;
    if (bVar1) {
      if (warnCMP0063 == (string *)0x0) {
        psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
        (*lg->_vptr_cmLocalGenerator[6])(lg,flags,psVar2);
        local_c8 = 0;
      }
      else {
        std::__cxx11::string::operator+=((string *)warnCMP0063,"  VISIBILITY_INLINES_HIDDEN\n");
        local_c8 = 1;
      }
    }
    else {
      local_c8 = 1;
    }
  }
  else {
    local_c8 = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void AddInlineVisibilityCompileOption(std::string& flags,
                                             cmGeneratorTarget const* target,
                                             cmLocalGenerator* lg,
                                             std::string* warnCMP0063,
                                             const std::string& lang)
{
  std::string compileOption =
    cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN");
  cmValue opt = lg->GetMakefile()->GetDefinition(compileOption);
  if (!opt) {
    return;
  }

  bool prop = target->GetPropertyAsBool("VISIBILITY_INLINES_HIDDEN");
  if (!prop) {
    return;
  }
  if (warnCMP0063) {
    *warnCMP0063 += "  VISIBILITY_INLINES_HIDDEN\n";
    return;
  }
  lg->AppendFlags(flags, *opt);
}